

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkv_interface.cpp
# Opt level: O2

int __thiscall MkvInterface::close(MkvInterface *this,int __fd)

{
  KaxSegment *Master;
  KaxCues *this_00;
  uint64 uVar1;
  byte bVar2;
  bool bVar3;
  int extraout_EAX;
  int iVar4;
  EbmlMaster *Master_00;
  KaxDuration *pKVar5;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined7 extraout_var;
  filepos_t fVar6;
  StdIOCallback *output;
  
  flushCluster(this);
  output = this->m_file;
  iVar4 = extraout_EAX;
  if (output != (StdIOCallback *)0x0) {
    if (this->m_writeMode == true) {
      this_00 = this->m_cues;
      if ((this_00 != (KaxCues *)0x0) &&
         ((this_00->super_EbmlMaster).ElementList.
          super__Vector_base<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>.
          _M_impl.super__Vector_impl_data._M_finish !=
          (this_00->super_EbmlMaster).ElementList.
          super__Vector_base<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>.
          _M_impl.super__Vector_impl_data._M_start)) {
        libmatroska::KaxCues::Render(this_00,&output->super_IOCallback,this->m_writeDefaultValues);
        libmatroska::KaxSeekHead::IndexThis
                  (this->m_metaSeek,(EbmlElement *)this->m_cues,&this->m_fileSegment);
      }
      Master = &this->m_fileSegment;
      Master_00 = &libebml::GetChild<libmatroska::KaxInfo>(&Master->super_EbmlMaster)->
                   super_EbmlMaster;
      pKVar5 = libebml::GetChild<libmatroska::KaxDuration>(Master_00);
      (pKVar5->super_EbmlFloat).Value = (double)((float)this->m_frameCount * this->m_frameDuration);
      (pKVar5->super_EbmlFloat).super_EbmlElement.bValueIsSet = true;
      (*(Master_00->super_EbmlElement)._vptr_EbmlElement[8])(Master_00,0,0);
      iVar4 = (*(this->m_file->super_IOCallback)._vptr_IOCallback[5])();
      (*(this->m_file->super_IOCallback)._vptr_IOCallback[3])
                (this->m_file,(Master_00->super_EbmlElement).ElementPosition,0);
      libebml::EbmlElement::Render
                (&Master_00->super_EbmlElement,&this->m_file->super_IOCallback,false,false,false);
      (*(this->m_file->super_IOCallback)._vptr_IOCallback[3])
                (this->m_file,CONCAT44(extraout_var_00,iVar4),0);
      libebml::EbmlVoid::ReplaceWith
                (this->m_dummy,(EbmlElement *)this->m_metaSeek,&this->m_file->super_IOCallback,true,
                 false);
      (*(this->m_file->super_IOCallback)._vptr_IOCallback[3])(this->m_file,0,2);
      iVar4 = (*(this->m_file->super_IOCallback)._vptr_IOCallback[5])();
      uVar1 = (this->m_fileSegment).super_EbmlMaster.super_EbmlElement.ElementPosition;
      bVar2 = libebml::EbmlElement::HeadSize((EbmlElement *)Master);
      bVar3 = libebml::EbmlElement::ForceSize
                        ((EbmlElement *)Master,CONCAT44(extraout_var_01,iVar4) - (bVar2 + uVar1));
      iVar4 = (int)CONCAT71(extraout_var,bVar3);
      if (bVar3) {
        fVar6 = libebml::EbmlElement::OverwriteHead
                          ((EbmlElement *)Master,&this->m_file->super_IOCallback,false);
        iVar4 = (int)fVar6;
      }
      output = this->m_file;
      if (output == (StdIOCallback *)0x0) goto LAB_0018beaa;
    }
    iVar4 = (*(output->super_IOCallback)._vptr_IOCallback[6])(output);
    if (this->m_file != (StdIOCallback *)0x0) {
      iVar4 = (*(this->m_file->super_IOCallback)._vptr_IOCallback[1])();
    }
  }
LAB_0018beaa:
  this->m_file = (StdIOCallback *)0x0;
  return iVar4;
}

Assistant:

void MkvInterface::close()
{
    flushCluster();
    
    if (m_file != NULL && m_writeMode)
    {
        if (m_cues != NULL && m_cues->ListSize() > 0)
        {
            m_cues->Render(*m_file, m_writeDefaultValues);
            m_metaSeek->IndexThis(*m_cues, m_fileSegment);
        }
        
        KaxInfo & MyInfos = GetChild<KaxInfo>(m_fileSegment);

        KaxDuration &Duration = GetChild<KaxDuration>(MyInfos);
        *(static_cast<EbmlFloat *>(&Duration)) = m_frameDuration * m_frameCount;

        MyInfos.UpdateSize();

        uint64 origPos = m_file->getFilePointer();
        m_file->setFilePointer(MyInfos.GetElementPosition());
        MyInfos.Render(*m_file);
        m_file->setFilePointer(origPos);
        
        // write the seek head
        m_dummy->ReplaceWith(*m_metaSeek, *m_file);
        
        m_file->setFilePointer(0, seek_end);
	    if (m_fileSegment.ForceSize(m_file->getFilePointer() -
                                    m_fileSegment.GetElementPosition() -
                                    m_fileSegment.HeadSize()))
            m_fileSegment.OverwriteHead(*m_file);
    }
    
    if (m_file != NULL)
    {
        m_file->close();
        delete m_file;
    }
    m_file = NULL;
}